

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_functions.hh
# Opt level: O1

void write_bits(uchar *ch,size_t *bit_offset,unsigned_long_long val,size_t bits,Pipeline *pipeline)

{
  ulong uVar1;
  out_of_range *this;
  ulong uVar2;
  ulong uVar3;
  
  if (0x20 < bits) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"write_bits: too many bits requested");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (bits != 0) {
    do {
      uVar2 = *bit_offset + 1;
      uVar1 = bits;
      if (uVar2 < bits) {
        uVar1 = uVar2;
      }
      uVar3 = bits - uVar1;
      *ch = *ch | (byte)(((uint)(val >> ((byte)uVar3 & 0x3f)) & ~(-1 << ((byte)uVar1 & 0x1f))) <<
                        ((char)uVar2 - (byte)uVar1 & 0x1f));
      if (bits < uVar2) {
        *bit_offset = *bit_offset - uVar1;
      }
      else {
        (*pipeline->_vptr_Pipeline[2])(pipeline,ch,1);
        *bit_offset = 7;
        *ch = '\0';
      }
      bits = uVar3;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
write_bits(
    unsigned char& ch, size_t& bit_offset, unsigned long long val, size_t bits, Pipeline* pipeline)
{
    if (bits > 32) {
        throw std::out_of_range("write_bits: too many bits requested");
    }

    // bit_offset + 1 is the number of bits left in ch
# ifdef BITS_TESTING
    if (bits == 0) {
        QTC::TC("libtests", "bits write zero bits");
    }
# endif
    while (bits > 0) {
        size_t bits_to_write = std::min(bits, bit_offset + 1);
        unsigned char newval = static_cast<unsigned char>(
            (val >> (bits - bits_to_write)) & ((1U << bits_to_write) - 1));
        size_t bits_left_in_ch = bit_offset + 1 - bits_to_write;
        newval = static_cast<unsigned char>(newval << bits_left_in_ch);
        ch |= newval;
        if (bits_left_in_ch == 0) {
# ifdef BITS_TESTING
            QTC::TC("libtests", "bits write pipeline");
# endif
            pipeline->write(&ch, 1);
            bit_offset = 7;
            ch = 0;
        } else {
# ifdef BITS_TESTING
            QTC::TC("libtests", "bits write leftover");
# endif
            bit_offset -= bits_to_write;
        }
        bits -= bits_to_write;
# ifdef BITS_TESTING
        QTC::TC("libtests", "bits write iterations", ((bits > 8) ? 0 : (bits > 0) ? 1 : 2));
# endif
    }
}